

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

void __thiscall
helics::InputInfo::removeSource(InputInfo *this,GlobalHandle sourceToRemove,Time minTime)

{
  pointer pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pTVar2;
  pointer pGVar3;
  pointer pdVar4;
  pointer *ppdVar5;
  ulong uVar6;
  
  (this->inputUnits)._M_string_length = 0;
  *(this->inputUnits)._M_dataplus._M_p = '\0';
  (this->inputType)._M_string_length = 0;
  *(this->inputType)._M_dataplus._M_p = '\0';
  pGVar3 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar3) {
    uVar6 = 0;
    do {
      if ((pGVar3[uVar6].fed_id.gid == sourceToRemove.fed_id.gid.gid) &&
         (pGVar3[uVar6].handle.hid == sourceToRemove.handle.hid.hid)) {
        pvVar1 = (this->data_queues).
                 super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar4 = *(pointer *)
                  ((long)&pvVar1[uVar6].
                          super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if (pvVar1[uVar6].
            super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
            ._M_impl.super__Vector_impl_data._M_start != pdVar4) {
          ppdVar5 = (pointer *)
                    ((long)&pvVar1[uVar6].
                            super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                            ._M_impl.super__Vector_impl_data + 8);
          do {
            if (pdVar4[-1].time.internalTimeCode <= minTime.internalTimeCode) break;
            *ppdVar5 = pdVar4 + -1;
            this_00 = pdVar4[-1].data.
                      super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            pvVar1 = (this->data_queues).
                     super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar6;
            ppdVar5 = (pointer *)
                      ((long)&(pvVar1->
                              super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                              )._M_impl.super__Vector_impl_data + 8);
            pdVar4 = *ppdVar5;
          } while ((pvVar1->
                   super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                   )._M_impl.super__Vector_impl_data._M_start != pdVar4);
        }
        pTVar2 = (this->deactivated).
                 super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (minTime.internalTimeCode < pTVar2[uVar6].internalTimeCode) {
          pTVar2[uVar6].internalTimeCode = minTime.internalTimeCode;
        }
      }
      uVar6 = uVar6 + 1;
      pGVar3 = (this->input_sources).
               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->input_sources).
                                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar3 >> 3));
  }
  return;
}

Assistant:

void InputInfo::removeSource(GlobalHandle sourceToRemove, Time minTime)
{
    // the inputUnits and type are not determined anymore since the source list has changed
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < input_sources.size(); ++ii) {
        if (input_sources[ii] == sourceToRemove) {
            while ((!data_queues[ii].empty()) && (data_queues[ii].back().time > minTime)) {
                data_queues[ii].pop_back();
            }
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}